

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phrase.cpp
# Opt level: O0

vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_> *
jhu::thrax::minimalConsistentPairs
          (vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>
           *__return_storage_ptr__,Alignment *a,int maxSize)

{
  Point PVar1;
  bool bVar2;
  int iVar3;
  optional<jhu::thrax::Span> oVar4;
  size_type sVar5;
  reference pPVar6;
  iterator __first;
  iterator __last;
  Span *this;
  __normal_iterator<jhu::thrax::SpanPair_*,_std::vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>_>
  local_e8;
  const_iterator local_e0;
  const_iterator local_d8;
  Alignment *local_d0;
  SpanPair *local_c8;
  __normal_iterator<jhu::thrax::SpanPair_*,_std::vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>_>
  local_c0;
  __normal_iterator<jhu::thrax::SpanPair_*,_std::vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>_>
  local_b8;
  __normal_iterator<jhu::thrax::SpanPair_*,_std::vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>_>
  it;
  _Storage<jhu::thrax::Span,_true> local_9e;
  undefined2 local_9a;
  iterator iStack_98;
  optional<jhu::thrax::Span> tgt;
  __normal_iterator<jhu::thrax::SpanPair_*,_std::vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>_>
  local_78;
  __normal_iterator<jhu::thrax::SpanPair_*,_std::vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>_>
  it_1;
  Span src;
  Point endPoint;
  const_iterator __end3;
  const_iterator __begin3;
  Alignment *__range3;
  const_iterator cStack_48;
  Point startPoint;
  const_iterator __end2;
  const_iterator __begin2;
  Alignment *__range2;
  int maxSize_local;
  Alignment *a_local;
  vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_> *result;
  
  std::vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>::vector
            (__return_storage_ptr__);
  sVar5 = std::vector<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>::size(a);
  std::vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>::reserve
            (__return_storage_ptr__,(long)maxSize * sVar5);
  __end2 = std::vector<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>::begin(a);
  cStack_48 = std::vector<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>::end(a);
  do {
    bVar2 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffb8);
    if (!bVar2) {
      local_c0._M_current =
           (SpanPair *)
           std::vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>::begin
                     (__return_storage_ptr__);
      local_c8 = (SpanPair *)
                 std::vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>::end
                           (__return_storage_ptr__);
      local_d0 = a;
      local_b8 = std::
                 remove_if<__gnu_cxx::__normal_iterator<jhu::thrax::SpanPair*,std::vector<jhu::thrax::SpanPair,std::allocator<jhu::thrax::SpanPair>>>,jhu::thrax::minimalConsistentPairs(std::vector<jhu::thrax::Point,std::allocator<jhu::thrax::Point>>const&,int)::__1>
                           (local_c0,(__normal_iterator<jhu::thrax::SpanPair_*,_std::vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>_>
                                      )local_c8,(anon_class_8_1_54a39801_for__M_pred)a);
      __gnu_cxx::
      __normal_iterator<jhu::thrax::SpanPair_const*,std::vector<jhu::thrax::SpanPair,std::allocator<jhu::thrax::SpanPair>>>
      ::__normal_iterator<jhu::thrax::SpanPair*>
                ((__normal_iterator<jhu::thrax::SpanPair_const*,std::vector<jhu::thrax::SpanPair,std::allocator<jhu::thrax::SpanPair>>>
                  *)&local_d8,&local_b8);
      local_e8._M_current =
           (SpanPair *)
           std::vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>::end
                     (__return_storage_ptr__);
      __gnu_cxx::
      __normal_iterator<jhu::thrax::SpanPair_const*,std::vector<jhu::thrax::SpanPair,std::allocator<jhu::thrax::SpanPair>>>
      ::__normal_iterator<jhu::thrax::SpanPair*>
                ((__normal_iterator<jhu::thrax::SpanPair_const*,std::vector<jhu::thrax::SpanPair,std::allocator<jhu::thrax::SpanPair>>>
                  *)&local_e0,&local_e8);
      std::vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>::erase
                (__return_storage_ptr__,local_d8,local_e0);
      return __return_storage_ptr__;
    }
    pPVar6 = __gnu_cxx::
             __normal_iterator<const_jhu::thrax::Point_*,_std::vector<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>_>
             ::operator*(&__end2);
    PVar1 = *pPVar6;
    __end3 = std::vector<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>::begin(a);
    _src = std::vector<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>::end(a);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_jhu::thrax::Point_*,_std::vector<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>_>
                                       *)&src), bVar2) {
      pPVar6 = __gnu_cxx::
               __normal_iterator<const_jhu::thrax::Point_*,_std::vector<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>_>
               ::operator*(&__end3);
      it_1._M_current._4_4_ = *pPVar6;
      it_1._M_current._2_2_ = it_1._M_current._4_2_ + 1;
      it_1._M_current._0_2_ = PVar1.src;
      bVar2 = Span::empty((Span *)&it_1);
      if (!bVar2) {
        __first = std::vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>::begin
                            (__return_storage_ptr__);
        __last = std::vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>::end
                           (__return_storage_ptr__);
        local_78 = std::
                   find_if<__gnu_cxx::__normal_iterator<jhu::thrax::SpanPair*,std::vector<jhu::thrax::SpanPair,std::allocator<jhu::thrax::SpanPair>>>,jhu::thrax::minimalConsistentPairs(std::vector<jhu::thrax::Point,std::allocator<jhu::thrax::Point>>const&,int)::__0>
                             (__first._M_current,__last._M_current,
                              (anon_class_4_1_ba1d7944_for__M_pred)it_1._M_current._0_4_);
        iStack_98 = std::vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>::end
                              (__return_storage_ptr__);
        bVar2 = __gnu_cxx::operator!=(&local_78,&stack0xffffffffffffff68);
        if (!bVar2) {
          iVar3 = Span::size((Span *)&it_1);
          if (maxSize < iVar3) break;
          oVar4 = minimalTargetSpan(a,it_1._M_current._0_4_);
          local_9e = oVar4.super__Optional_base<jhu::thrax::Span,_true,_true>._M_payload.
                     super__Optional_payload_base<jhu::thrax::Span>._M_payload;
          local_9a = oVar4.super__Optional_base<jhu::thrax::Span,_true,_true>._M_payload.
                     super__Optional_payload_base<jhu::thrax::Span>._4_2_;
          bVar2 = std::optional<jhu::thrax::Span>::has_value
                            ((optional<jhu::thrax::Span> *)&local_9e._M_value);
          if (bVar2) {
            this = std::optional<jhu::thrax::Span>::operator->
                             ((optional<jhu::thrax::Span> *)&local_9e._M_value);
            iVar3 = Span::size(this);
            if (iVar3 <= maxSize) {
              it._M_current._4_4_ = it_1._M_current._0_4_;
              std::optional<jhu::thrax::Span>::operator*
                        ((optional<jhu::thrax::Span> *)&local_9e._M_value);
              std::vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>::push_back
                        (__return_storage_ptr__,(value_type *)((long)&it._M_current + 4));
            }
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<const_jhu::thrax::Point_*,_std::vector<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>_>
      ::operator++(&__end3);
    }
    __gnu_cxx::
    __normal_iterator<const_jhu::thrax::Point_*,_std::vector<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

std::vector<SpanPair> minimalConsistentPairs(const Alignment& a, int maxSize) {
  std::vector<SpanPair> result;
  result.reserve(maxSize * a.size());  // over-estimate
  for (auto startPoint : a) {
    for (auto endPoint : a) {
      Span src{ startPoint.src, static_cast<IndexType>(endPoint.src + 1) };
      if (src.empty()) {
        continue;
      } else if (auto it = std::find_if(
          result.begin(), result.end(), [src](auto p) { return src == p.src; });
          it != result.end()) {
        continue;
      } else if (src.size() > maxSize) {
        break;
      }
      if (auto tgt = minimalTargetSpan(a, src);
          tgt.has_value() && tgt->size() <= maxSize) {
        result.push_back(SpanPair{ src, *tgt });
      }
    }
  }
  auto it = std::remove_if(
      result.begin(),
      result.end(),
      [&a](auto sp) { return !isConsistent(a, sp); });
  result.erase(it, result.end());
  return result;
}